

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Person.cpp
# Opt level: O1

void __thiscall mbc::Val::Person::Person(Person *this)

{
  string *psVar1;
  Str *pSVar2;
  VecStr *this_00;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  ValBase::ValBase(&this->super_ValBase);
  (this->super_ValBase)._vptr_ValBase = (_func_int **)&PTR__Person_001407b8;
  *(this->super_ValBase).is_vaild_ = true;
  psVar1 = (this->super_ValBase).invaild_waring_;
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)psVar1->_M_string_length,0x131df8);
  pSVar2 = (Str *)operator_new(0x38);
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_110 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Person.cpp:30:31)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Person.cpp:30:31)>
              ::_M_manager;
  Str::Str(pSVar2,(function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&local_128);
  this->ID_ = pSVar2;
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  pSVar2 = (Str *)operator_new(0x38);
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Person.cpp:31:31)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Person.cpp:31:31)>
             ::_M_manager;
  Str::Str(pSVar2,(function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&local_108);
  this->name_ = pSVar2;
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  pSVar2 = (Str *)operator_new(0x38);
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Person.cpp:32:31)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Person.cpp:32:31)>
             ::_M_manager;
  Str::Str(pSVar2,(function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&local_e8);
  this->sex_ = pSVar2;
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  pSVar2 = (Str *)operator_new(0x38);
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Person.cpp:33:31)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Person.cpp:33:31)>
             ::_M_manager;
  Str::Str(pSVar2,(function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&local_c8);
  this->telephone_ = pSVar2;
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  pSVar2 = (Str *)operator_new(0x38);
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Person.cpp:34:31)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Person.cpp:34:31)>
             ::_M_manager;
  Str::Str(pSVar2,(function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&local_a8);
  this->mail_number_ = pSVar2;
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  pSVar2 = (Str *)operator_new(0x38);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Person.cpp:37:31)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Person.cpp:37:31)>
             ::_M_manager;
  Str::Str(pSVar2,(function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&local_88);
  this->email_ = pSVar2;
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  pSVar2 = (Str *)operator_new(0x38);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Person.cpp:38:31)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Person.cpp:38:31)>
             ::_M_manager;
  Str::Str(pSVar2,(function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&local_68);
  this->qq_number_ = pSVar2;
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  pSVar2 = (Str *)operator_new(0x38);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Person.cpp:39:31)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_Person.cpp:39:31)>
             ::_M_manager;
  Str::Str(pSVar2,(function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&local_48);
  this->location_ = pSVar2;
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  this_00 = (VecStr *)operator_new(0x38);
  VecStr::VecStr(this_00);
  this->classes_ = this_00;
  update_ID_(this);
  return;
}

Assistant:

Person::Person() : ValBase() {
    using namespace units;

    *is_vaild_       = true;
    *invaild_waring_ = "[invaild person]";

    ID_             = new Str([](const string& str){return is_not_empty(str);});
    name_           = new Str([](const string& str){return is_not_empty(str);});
    sex_            = new Str([](const string& str){return str == "M" || str == "F";});
    telephone_      = new Str([](const string& str){return is_digit(str);});
    mail_number_    = new Str([](const string& str){
                            return is_digit(str) && str.size() == 6;
                            });
    email_          = new Str([](const string& str){return is_email(str);});
    qq_number_      = new Str([](const string& str){return is_digit(str);});
    location_       = new Str([](const string& str){return is_not_empty(str);});

    classes_        = new VecStr();

    update_ID_();
}